

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_Plane * Internal_ON_Plane_NanPlane(void)

{
  ON_Plane *in_RDI;
  ON_Plane *nan_plane;
  
  ON_Plane::ON_Plane(in_RDI);
  (in_RDI->xaxis).x = ON_3dVector::NanVector.x;
  (in_RDI->xaxis).y = ON_3dVector::NanVector.y;
  (in_RDI->xaxis).z = ON_3dVector::NanVector.z;
  (in_RDI->yaxis).x = ON_3dVector::NanVector.x;
  (in_RDI->yaxis).y = ON_3dVector::NanVector.y;
  (in_RDI->yaxis).z = ON_3dVector::NanVector.z;
  (in_RDI->zaxis).x = ON_3dVector::NanVector.x;
  (in_RDI->zaxis).y = ON_3dVector::NanVector.y;
  (in_RDI->zaxis).z = ON_3dVector::NanVector.z;
  (in_RDI->origin).x = ON_3dPoint::NanPoint.x;
  (in_RDI->origin).y = ON_3dPoint::NanPoint.y;
  (in_RDI->origin).z = ON_3dPoint::NanPoint.z;
  (in_RDI->plane_equation).x = ON_PlaneEquation::NanPlaneEquation.x;
  (in_RDI->plane_equation).y = ON_PlaneEquation::NanPlaneEquation.y;
  (in_RDI->plane_equation).z = ON_PlaneEquation::NanPlaneEquation.z;
  (in_RDI->plane_equation).d = ON_PlaneEquation::NanPlaneEquation.d;
  return in_RDI;
}

Assistant:

static ON_Plane Internal_ON_Plane_NanPlane()
{
  ON_Plane nan_plane;
  nan_plane.xaxis = ON_3dVector::NanVector;
  nan_plane.yaxis = ON_3dVector::NanVector;
  nan_plane.zaxis = ON_3dVector::NanVector;
  nan_plane.origin = ON_3dPoint::NanPoint;
  nan_plane.plane_equation = ON_PlaneEquation::NanPlaneEquation;
  return nan_plane;
}